

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O2

bool absl::lts_20240722::log_internal::EncodeVarint(uint64_t tag,uint64_t value,Span<char> *buf)

{
  size_type n;
  size_t size;
  size_t size_00;
  
  size = VarintSize(tag << 3);
  size_00 = VarintSize(value);
  n = buf->len_;
  if (n < size_00 + size) {
    Span<char>::remove_suffix(buf,n);
  }
  else {
    anon_unknown_1::EncodeRawVarint(tag << 3,size,buf);
    anon_unknown_1::EncodeRawVarint(value,size_00,buf);
  }
  return size_00 + size <= n;
}

Assistant:

bool EncodeVarint(uint64_t tag, uint64_t value, absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::kVarint);
  const size_t tag_type_size = VarintSize(tag_type);
  const size_t value_size = VarintSize(value);
  if (tag_type_size + value_size > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  EncodeRawVarint(value, value_size, buf);
  return true;
}